

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svwaitup.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  tai when;
  tai now;
  char status [18];
  char sulong [40];
  strerr *se;
  tai local_88;
  tai local_80;
  char local_78 [12];
  int local_6c;
  char local_58 [40];
  
  progname = *argv;
  iVar3 = sgetoptmine(argc,argv,"s:vV");
  bVar2 = true;
  if (iVar3 != subgetoptdone) {
    bVar2 = false;
    do {
      if (iVar3 < 0x73) {
        if (iVar3 != 0x3f) {
          if (iVar3 != 0x56) goto LAB_00102364;
          strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                      (strerr *)0x0);
        }
LAB_00102330:
        strerr_die(1,"usage: ",progname," [-v] [-s 1..600] service ...","\n",(char *)0x0,(char *)0x0
                   ,(strerr *)0x0);
      }
      else if (iVar3 == 0x76) {
        bVar2 = true;
      }
      else if ((iVar3 == 0x73) && (scan_ulong(subgetoptarg,&sec), sec - 0x259 < 0xfffffffffffffda8))
      goto LAB_00102330;
LAB_00102364:
      iVar3 = sgetoptmine(argc,argv,"s:vV");
    } while (iVar3 != subgetoptdone);
    bVar2 = !bVar2;
  }
  lVar9 = (long)subgetoptind;
  if (argv[lVar9] == (char *)0x0) {
    strerr_die(1,"usage: ",progname," [-v] [-s 1..600] service ...","\n",(char *)0x0,(char *)0x0,
               (strerr *)0x0);
  }
  ppcVar1 = argv + lVar9;
  iVar3 = open_read(".");
  if (iVar3 == -1) {
    strerr_die(0x6f,"svwaitup: fatal: ","unable to open current working directory",": ",(char *)0x0,
               (char *)0x0,(char *)0x0,&strerr_sys);
  }
  pcVar8 = *ppcVar1;
  dir = ppcVar1;
  do {
    if (pcVar8 == (char *)0x0) {
      iVar4 = fchdir(iVar3);
      if (iVar4 == -1) {
        strerr_warn("svwaitup: warning: ","unable to switch to starting directory: ",(char *)0x0,
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      }
      close(iVar3);
      if (100 < rc) {
        rc = 100;
      }
      _exit(rc);
    }
    if ((dir != ppcVar1) && (iVar4 = fchdir(iVar3), iVar4 == -1)) {
      strerr_die(0x6f,"svwaitup: fatal: ","unable to switch to starting directory",": ",(char *)0x0,
                 (char *)0x0,(char *)0x0,&strerr_sys);
    }
    iVar4 = chdir(*dir);
    if (iVar4 == -1) {
      pcVar8 = *dir;
      dir = dir + 1;
      rc = rc + 1;
      se = &strerr_sys;
      pcVar7 = ": unable to change directory: ";
LAB_001026a9:
      strerr_warn("svwaitup: warning: ",pcVar8,pcVar7,(char *)0x0,(char *)0x0,(char *)0x0,se);
    }
    else {
      iVar4 = open_write("supervise/ok");
      if (iVar4 == -1) {
        piVar6 = __errno_location();
        pcVar8 = *dir;
        rc = rc + 1;
        dir = dir + 1;
        if (*piVar6 == error_nodevice) {
          se = (strerr *)0x0;
          pcVar7 = ": runsv not running.";
        }
        else {
          se = &strerr_sys;
          pcVar7 = ": unable to open supervise/ok: ";
        }
        goto LAB_001026a9;
      }
      close(iVar4);
      iVar4 = open_read("supervise/status");
      if (iVar4 == -1) {
        pcVar8 = *dir;
        dir = dir + 1;
        rc = rc + 1;
        se = &strerr_sys;
        pcVar7 = "unable to open supervise/status: ";
        goto LAB_001026a9;
      }
      uVar5 = buffer_unixread(iVar4,local_78,0x12);
      close(iVar4);
      if (uVar5 < 0x12) {
        pcVar8 = *dir;
        pcVar7 = ": unable to read supervise/status: bad format.";
LAB_001026e5:
        dir = dir + 1;
        rc = rc + 1;
        strerr_warn("svwaitup: warning: ",pcVar8,pcVar7,(char *)0x0,(char *)0x0,(char *)0x0,
                    (strerr *)0x0);
      }
      else {
        if (local_6c == 0) {
          pcVar8 = *dir;
          pcVar7 = ": is down.";
          goto LAB_001026e5;
        }
        tai_unpack(local_78,&local_88);
        tai_now(&local_80);
        if (local_80.x < local_88.x) {
          local_88.x = local_80.x;
        }
        tai_sub(&local_88,&local_80,&local_88);
        iVar4 = (int)local_88.x;
        if ((ulong)(long)iVar4 < sec) {
          sleep((int)sec - iVar4);
        }
        else {
          if (!bVar2) {
            uVar5 = fmt_ulong(local_58,(long)iVar4);
            local_58[uVar5] = '\0';
            strerr_warn("svwaitup: ",*dir,": is up (",local_58," seconds)",(char *)0x0,(strerr *)0x0
                       );
          }
          dir = dir + 1;
        }
      }
    }
    pcVar8 = *dir;
  } while( true );
}

Assistant:

int main(int argc, const char * const *argv) {
  int opt;
  int verbose =0;
  char status[18];
  int fd;
  int is;
  int r;
  int wdir;
  unsigned long pid;
  struct tai when;
  struct tai now;
  char sulong[FMT_ULONG];

  progname =*argv;

  while ((opt =getopt(argc, argv, "s:vV")) != opteof) {
    switch(opt) {
    case 's':
      scan_ulong(optarg, &sec);
      if ((sec < 1) || (sec > 600)) usage();
      break;
    case 'v':
      verbose =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");

  dir =argv;
  while (*dir) {
    if (dir != argv)
      if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) {
      warn(*dir, ": unable to change directory: ", &strerr_sys);
      continue;
    }
    if ((fd =open_write("supervise/ok")) == -1) {
      if (errno == error_nodevice)
        warn(*dir, ": runsv not running.", 0);
      else
        warn(*dir, ": unable to open supervise/ok: ", &strerr_sys);
      continue;
    }
    close(fd);

    if ((fd =open_read("supervise/status")) == -1) {
      warn(*dir, "unable to open supervise/status: ", &strerr_sys);
      continue;
    }
    r =buffer_unixread(fd, status, sizeof status);
    close(fd);
    if (r < sizeof status) {
      if (r == -1)
        warn(*dir, "unable to read supervise/status: ", &strerr_sys);
      else
        warn(*dir, ": unable to read supervise/status: bad format.", 0);
      continue;
    }

    pid =(unsigned char)status[15];
    pid <<=8; pid +=(unsigned char)status[14];
    pid <<=8; pid +=(unsigned char)status[13];
    pid <<=8; pid +=(unsigned char)status[12];
    if (! pid) {
      warn(*dir, ": is down.", 0);
      continue;
    }

    tai_unpack(status, &when);
    tai_now(&now);
    if (tai_less(&now, &when)) when =now;
    tai_sub(&when, &now, &when);
    is =tai_approx(&when);

    if (is >= sec) {
      /* ok */
      if (verbose) {
        sulong[fmt_ulong(sulong, is)] =0;
        strerr_warn5(INFO, *dir, ": is up (", sulong, " seconds)", 0);
      }
      dir++;
      continue;
    }
    sleep(sec -is);
  }
  if (fchdir(wdir) == -1)
    strerr_warn2(WARN, "unable to switch to starting directory: ", &strerr_sys);
  close(wdir);
  if (rc > 100) rc =100;
  _exit(rc);
}